

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

void glslang::OptimizerMesssageConsumer
               (spv_message_level_t level,char *source,spv_position_t *position,char *message)

{
  ostream *poVar1;
  ostream *out;
  char *message_local;
  spv_position_t *position_local;
  char *source_local;
  spv_message_level_t level_local;
  
  if (level < SPV_MSG_WARNING) {
    std::operator<<((ostream *)&std::cerr,"error: ");
  }
  else if (level == SPV_MSG_WARNING) {
    std::operator<<((ostream *)&std::cerr,"warning: ");
  }
  else if (level - SPV_MSG_INFO < 2) {
    std::operator<<((ostream *)&std::cerr,"info: ");
  }
  if (source != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,source);
    std::operator<<(poVar1,":");
  }
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,position->line);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,position->column);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,position->index);
  std::operator<<(poVar1,":");
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," ");
    std::operator<<(poVar1,message);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void OptimizerMesssageConsumer(spv_message_level_t level, const char *source,
        const spv_position_t &position, const char *message)
{
    auto &out = std::cerr;
    switch (level)
    {
    case SPV_MSG_FATAL:
    case SPV_MSG_INTERNAL_ERROR:
    case SPV_MSG_ERROR:
        out << "error: ";
        break;
    case SPV_MSG_WARNING:
        out << "warning: ";
        break;
    case SPV_MSG_INFO:
    case SPV_MSG_DEBUG:
        out << "info: ";
        break;
    default:
        break;
    }
    if (source)
    {
        out << source << ":";
    }
    out << position.line << ":" << position.column << ":" << position.index << ":";
    if (message)
    {
        out << " " << message;
    }
    out << std::endl;
}